

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_int nrminfindex(cupdlp_int n,double *x,cupdlp_int incx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  uVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (dVar4 < ABS(x[uVar2])) {
      uVar1 = uVar2 & 0xffffffff;
      dVar4 = ABS(x[uVar2]);
    }
  }
  return (cupdlp_int)uVar1;
}

Assistant:

cupdlp_int nrminfindex(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;
  cupdlp_int index = 0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) {
      nrm = tmp;
      index = i;
    }
  }

  return index;
#else
  return dnrminfindex(n, x, incx);
#endif
}